

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall libcellml::Model::~Model(Model *this)

{
  ModelImpl *this_00;
  
  (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
       (_func_int **)&PTR__Model_002a0050;
  this_00 = (ModelImpl *)
            (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl
  ;
  if (this_00 != (ModelImpl *)0x0) {
    ModelImpl::~ModelImpl(this_00);
  }
  operator_delete(this_00,0xa0);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<libcellml::Model>)._M_weak_this.
              super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Entity::~Entity((Entity *)this);
  return;
}

Assistant:

Model::~Model()
{
    delete pFunc();
}